

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<const_ot::commissioner::EnergyReport_*> *
testing::internal::ActionResultHolder<ot::commissioner::EnergyReport_const*>::
PerformAction<ot::commissioner::EnergyReport_const*(ot::commissioner::Address_const&)>
          (Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *action
          ,ArgumentTuple *args)

{
  ActionResultHolder<const_ot::commissioner::EnergyReport_*> *pAVar1;
  Result pEVar2;
  _Head_base<0UL,_const_ot::commissioner::Address_&,_false> local_20;
  
  pAVar1 = (ActionResultHolder<const_ot::commissioner::EnergyReport_*> *)operator_new(0x10);
  local_20._M_head_impl =
       (args->super__Tuple_impl<0UL,_const_ot::commissioner::Address_&>).
       super__Head_base<0UL,_const_ot::commissioner::Address_&,_false>._M_head_impl;
  pEVar2 = Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
           Perform(action,(ArgumentTuple *)&local_20);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002e4518;
  (pAVar1->result_).value_ = pEVar2;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }